

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnAtomicWaitExpr
          (BinaryReaderIR *this,Opcode opcode,uint32_t alignment_log2,Address offset)

{
  int local_34;
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)4>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)4>_>_>
  local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  Address local_20;
  uint32_t local_1c;
  Address offset_local;
  uint32_t alignment_log2_local;
  BinaryReaderIR *this_local;
  Opcode opcode_local;
  
  local_1c._0_1_ = (byte)alignment_log2;
  local_34 = 1 << ((byte)local_1c & 0x1f);
  local_20 = offset;
  local_1c = alignment_log2;
  _offset_local = this;
  this_local._0_4_ = opcode.enum_;
  MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Opcode&,int,unsigned_int&>
            ((wabt *)&local_30,(Opcode *)&this_local,&local_34,&local_20);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)4>,std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)4>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::
  unique_ptr<wabt::LoadStoreExpr<(wabt::ExprType)4>,_std::default_delete<wabt::LoadStoreExpr<(wabt::ExprType)4>_>_>
  ::~unique_ptr(&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result BinaryReaderIR::OnAtomicWaitExpr(Opcode opcode,
                                              uint32_t alignment_log2,
                                              Address offset) {
  return AppendExpr(
      MakeUnique<AtomicWaitExpr>(opcode, 1 << alignment_log2, offset));
}